

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O2

bool __thiscall
cmDependsC::WriteDependencies
          (cmDependsC *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources,string *obj,ostream *makeDepends,ostream *internalDepends)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *this_01;
  char cVar1;
  UnscannedEntry *pUVar2;
  value_type *pvVar3;
  string *psVar4;
  cmGlobalGenerator *pcVar5;
  cmLocalUnixMakefileGenerator3 *this_02;
  bool bVar6;
  BOM BVar7;
  const_iterator cVar8;
  iterator iVar9;
  iterator iVar10;
  iterator iVar11;
  mapped_type *this_03;
  ostream *poVar12;
  _Base_ptr p_Var13;
  UnscannedEntry *inc;
  value_type *__x;
  string *in_base;
  int local_388;
  string fullName;
  UnscannedEntry current;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scanned;
  string obj_i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  string dir;
  string obj_m;
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [29];
  
  if (((sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     ((sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent == (_Base_ptr)0x0
     )) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&obj_m,"Cannot scan dependencies without a source file.",
               (allocator<char> *)&current);
    cmSystemTools::Error(&obj_m);
  }
  else {
    if (obj->_M_string_length != 0) {
      dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
      dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      cmOutputConverter::MaybeRelativeToTopBinDir
                (&obj_i,(cmOutputConverter *)(this->super_cmDepends).LocalGenerator,obj);
      if ((&this->ValidDeps->_M_t ==
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)0x0) ||
         (cVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::find(&this->ValidDeps->_M_t,&obj_i),
         (_Rb_tree_header *)cVar8._M_node == &(this->ValidDeps->_M_t)._M_impl.super__Rb_tree_header)
         ) {
        local_388 = (int)(sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        this_00 = &this->Encountered;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this_00->_M_t);
        this_01 = &this->Unscanned;
        for (p_Var13 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var13 != &(sources->_M_t)._M_impl.super__Rb_tree_header;
            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
          obj_m._M_dataplus._M_p = (pointer)&obj_m.field_2;
          obj_m._M_string_length = 0;
          obj_m.field_2._M_local_buf[0] = '\0';
          local_218._M_p = (pointer)local_208;
          local_210 = 0;
          local_208[0]._M_local_buf[0] = '\0';
          std::__cxx11::string::_M_assign((string *)&obj_m);
          std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
          push_back(&this_01->c,(UnscannedEntry *)&obj_m);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var13 + 1));
          UnscannedEntry::~UnscannedEntry((UnscannedEntry *)&obj_m);
        }
        scanned._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &scanned._M_t._M_impl.super__Rb_tree_header._M_header;
        scanned._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        scanned._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        scanned._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        scanned._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             scanned._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          pUVar2 = (this->Unscanned).c.
                   super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          if ((this->Unscanned).c.
              super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur == pUVar2) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&scanned._M_t);
            goto LAB_005241fd;
          }
          UnscannedEntry::UnscannedEntry(&current,pUVar2);
          std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
          pop_front(&this_01->c);
          fullName._M_dataplus._M_p = (pointer)&fullName.field_2;
          fullName._M_string_length = 0;
          fullName.field_2._M_local_buf[0] = '\0';
          if ((0 < local_388) ||
             (bVar6 = cmsys::SystemTools::FileIsFullPath(&current.FileName), bVar6)) {
            bVar6 = cmsys::SystemTools::FileExists(&current.FileName,true);
            if (bVar6) goto LAB_00523ee2;
          }
          else if ((current.QuotedLocation._M_string_length == 0) ||
                  (bVar6 = cmsys::SystemTools::FileExists(&current.QuotedLocation,true), !bVar6)) {
            iVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find(&(this->HeaderLocationCache)._M_t,&current.FileName);
            if ((_Rb_tree_header *)iVar11._M_node ==
                &(this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header) {
              psVar4 = (this->super_cmDepends).IncludePath.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (in_base = (this->super_cmDepends).IncludePath.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; in_base != psVar4;
                  in_base = in_base + 1) {
                cmsys::SystemTools::CollapseFullPath(&obj_m,&current.FileName,in_base);
                bVar6 = cmsys::SystemTools::FileExists(&obj_m,true);
                if (bVar6) {
                  std::__cxx11::string::_M_assign((string *)&fullName);
                  this_03 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&this->HeaderLocationCache,&current.FileName);
                  std::__cxx11::string::operator=((string *)this_03,(string *)&obj_m);
                  std::__cxx11::string::~string((string *)&obj_m);
                  break;
                }
                std::__cxx11::string::~string((string *)&obj_m);
              }
            }
            else {
              std::__cxx11::string::_M_assign((string *)&fullName);
            }
          }
          else {
LAB_00523ee2:
            std::__cxx11::string::_M_assign((string *)&fullName);
          }
          if (fullName._M_string_length == 0) {
            bVar6 = cmsys::RegularExpression::find
                              (&this->IncludeRegexComplain,current.FileName._M_dataplus._M_p);
            if (!bVar6) {
              if (fullName._M_string_length != 0) goto LAB_00523ef4;
              goto LAB_00523f17;
            }
            std::operator+(&dir,"Cannot find file \"",&current.FileName);
            std::operator+(&obj_m,&dir,"\".");
            cmSystemTools::Error(&obj_m);
            std::__cxx11::string::~string((string *)&obj_m);
            std::__cxx11::string::~string((string *)&dir);
            bVar6 = false;
          }
          else {
LAB_00523ef4:
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&scanned._M_t,&fullName);
            if ((_Rb_tree_header *)iVar9._M_node == &scanned._M_t._M_impl.super__Rb_tree_header) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&scanned,&fullName);
              iVar10 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>_>
                       ::find(&(this->FileCache)._M_t,&fullName);
              if ((_Rb_tree_header *)iVar10._M_node ==
                  &(this->FileCache)._M_t._M_impl.super__Rb_tree_header) {
                std::ifstream::ifstream(&obj_m,fullName._M_dataplus._M_p,_S_in);
                if (((*(byte *)((long)&local_218._M_p + *(long *)(obj_m._M_dataplus._M_p + -0x18)) &
                     5) == 0) &&
                   (BVar7 = cmsys::FStream::ReadBOM((istream *)&obj_m), BVar7 < BOM_UTF16BE)) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&dependencies,&fullName);
                  cmsys::SystemTools::GetFilenamePath(&dir,&fullName);
                  Scan(this,(istream *)&obj_m,&dir,&fullName);
                  std::__cxx11::string::~string((string *)&dir);
                }
                std::ifstream::~ifstream(&obj_m);
              }
              else {
                *(undefined1 *)&iVar10._M_node[2]._M_right = 1;
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&dependencies,&fullName);
                pvVar3 = (value_type *)iVar10._M_node[2]._M_parent;
                for (__x = *(value_type **)(iVar10._M_node + 2); __x != pvVar3; __x = __x + 1) {
                  iVar9 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::find(&this_00->_M_t,&__x->FileName);
                  if ((_Rb_tree_header *)iVar9._M_node ==
                      &(this->Encountered)._M_t._M_impl.super__Rb_tree_header) {
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)this_00,&__x->FileName);
                    std::
                    deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
                    push_back(&this_01->c,__x);
                  }
                }
              }
            }
LAB_00523f17:
            local_388 = local_388 + -1;
            bVar6 = true;
          }
          std::__cxx11::string::~string((string *)&fullName);
          UnscannedEntry::~UnscannedEntry(&current);
        } while (bVar6);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&scanned._M_t);
        bVar6 = false;
      }
      else {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&dependencies,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (cVar8._M_node + 2),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cVar8._M_node[2]._M_parent);
LAB_005241fd:
        cmLocalUnixMakefileGenerator3::ConvertToMakefilePath
                  (&obj_m,(this->super_cmDepends).LocalGenerator,&obj_i);
        poVar12 = std::operator<<(internalDepends,(string *)&obj_i);
        std::operator<<(poVar12,'\n');
        if (dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          pcVar5 = (((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                   super_cmLocalGenerator.GlobalGenerator;
          cVar1 = *(char *)((long)&pcVar5[1].LocalGenerators.
                                   super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 4);
          if (cVar1 == '\x01') {
            poVar12 = std::operator<<(makeDepends,(string *)&obj_m);
            std::operator<<(poVar12,':');
          }
          for (p_Var13 = dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var13 != &dependencies._M_t._M_impl.super__Rb_tree_header;
              p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
            this_02 = (this->super_cmDepends).LocalGenerator;
            cmOutputConverter::MaybeRelativeToTopBinDir
                      ((string *)&scanned,(cmOutputConverter *)this_02,(string *)(p_Var13 + 1));
            cmLocalUnixMakefileGenerator3::ConvertToMakefilePath
                      (&current.FileName,this_02,(string *)&scanned);
            std::__cxx11::string::~string((string *)&scanned);
            if (cVar1 == '\0') {
              poVar12 = std::operator<<(makeDepends,(string *)&obj_m);
              poVar12 = std::operator<<(poVar12,": ");
              poVar12 = std::operator<<(poVar12,(string *)&current);
              std::operator<<(poVar12,'\n');
            }
            else {
              poVar12 = std::operator<<(makeDepends,' ');
              poVar12 = std::operator<<(poVar12,(string *)&pcVar5[1].Makefiles);
              poVar12 = std::operator<<(poVar12,' ');
              std::operator<<(poVar12,(string *)&current);
            }
            poVar12 = std::operator<<(internalDepends,' ');
            poVar12 = std::operator<<(poVar12,(string *)(p_Var13 + 1));
            std::operator<<(poVar12,'\n');
            std::__cxx11::string::~string((string *)&current);
          }
          std::operator<<(makeDepends,'\n');
        }
        std::__cxx11::string::~string((string *)&obj_m);
        bVar6 = true;
      }
      std::__cxx11::string::~string((string *)&obj_i);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&dependencies._M_t);
      return bVar6;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&obj_m,"Cannot scan dependencies without an object file.",
               (allocator<char> *)&current);
    cmSystemTools::Error(&obj_m);
  }
  std::__cxx11::string::~string((string *)&obj_m);
  return false;
}

Assistant:

bool cmDependsC::WriteDependencies(const std::set<std::string>& sources,
                                   const std::string& obj,
                                   std::ostream& makeDepends,
                                   std::ostream& internalDepends)
{
  // Make sure this is a scanning instance.
  if (sources.empty() || sources.begin()->empty()) {
    cmSystemTools::Error("Cannot scan dependencies without a source file.");
    return false;
  }
  if (obj.empty()) {
    cmSystemTools::Error("Cannot scan dependencies without an object file.");
    return false;
  }

  std::set<std::string> dependencies;
  bool haveDeps = false;

  // Compute a path to the object file to write to the internal depend file.
  // Any existing content of the internal depend file has already been
  // loaded in ValidDeps with this path as a key.
  std::string obj_i = this->LocalGenerator->MaybeRelativeToTopBinDir(obj);

  if (this->ValidDeps != nullptr) {
    auto const tmpIt = this->ValidDeps->find(obj_i);
    if (tmpIt != this->ValidDeps->end()) {
      dependencies.insert(tmpIt->second.begin(), tmpIt->second.end());
      haveDeps = true;
    }
  }

  if (!haveDeps) {
    // Walk the dependency graph starting with the source file.
    int srcFiles = static_cast<int>(sources.size());
    this->Encountered.clear();

    for (std::string const& src : sources) {
      UnscannedEntry root;
      root.FileName = src;
      this->Unscanned.push(root);
      this->Encountered.insert(src);
    }

    std::set<std::string> scanned;
    while (!this->Unscanned.empty()) {
      // Get the next file to scan.
      UnscannedEntry current = this->Unscanned.front();
      this->Unscanned.pop();

      // If not a full path, find the file in the include path.
      std::string fullName;
      if ((srcFiles > 0) || cmSystemTools::FileIsFullPath(current.FileName)) {
        if (cmSystemTools::FileExists(current.FileName, true)) {
          fullName = current.FileName;
        }
      } else if (!current.QuotedLocation.empty() &&
                 cmSystemTools::FileExists(current.QuotedLocation, true)) {
        // The include statement producing this entry was a double-quote
        // include and the included file is present in the directory of
        // the source containing the include statement.
        fullName = current.QuotedLocation;
      } else {
        auto headerLocationIt =
          this->HeaderLocationCache.find(current.FileName);
        if (headerLocationIt != this->HeaderLocationCache.end()) {
          fullName = headerLocationIt->second;
        } else {
          for (std::string const& iPath : this->IncludePath) {
            // Construct the name of the file as if it were in the current
            // include directory.  Avoid using a leading "./".
            std::string tmpPath =
              cmSystemTools::CollapseFullPath(current.FileName, iPath);

            // Look for the file in this location.
            if (cmSystemTools::FileExists(tmpPath, true)) {
              fullName = tmpPath;
              this->HeaderLocationCache[current.FileName] = std::move(tmpPath);
              break;
            }
          }
        }
      }

      // Complain if the file cannot be found and matches the complain
      // regex.
      if (fullName.empty() &&
          this->IncludeRegexComplain.find(current.FileName)) {
        cmSystemTools::Error("Cannot find file \"" + current.FileName + "\".");
        return false;
      }

      // Scan the file if it was found and has not been scanned already.
      if (!fullName.empty() && (scanned.find(fullName) == scanned.end())) {
        // Record scanned files.
        scanned.insert(fullName);

        // Check whether this file is already in the cache
        auto fileIt = this->FileCache.find(fullName);
        if (fileIt != this->FileCache.end()) {
          fileIt->second.Used = true;
          dependencies.insert(fullName);
          for (UnscannedEntry const& inc : fileIt->second.UnscannedEntries) {
            if (this->Encountered.find(inc.FileName) ==
                this->Encountered.end()) {
              this->Encountered.insert(inc.FileName);
              this->Unscanned.push(inc);
            }
          }
        } else {

          // Try to scan the file.  Just leave it out if we cannot find
          // it.
          cmsys::ifstream fin(fullName.c_str());
          if (fin) {
            cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
            if (bom == cmsys::FStream::BOM_None ||
                bom == cmsys::FStream::BOM_UTF8) {
              // Add this file as a dependency.
              dependencies.insert(fullName);

              // Scan this file for new dependencies.  Pass the directory
              // containing the file to handle double-quote includes.
              std::string dir = cmSystemTools::GetFilenamePath(fullName);
              this->Scan(fin, dir, fullName);
            } else {
              // Skip file with encoding we do not implement.
            }
          }
        }
      }

      srcFiles--;
    }
  }

  // Write the dependencies to the output stream.  Makefile rules
  // written by the original local generator for this directory
  // convert the dependencies to paths relative to the home output
  // directory.  We must do the same here.
  std::string obj_m = this->LocalGenerator->ConvertToMakefilePath(obj_i);
  internalDepends << obj_i << '\n';
  if (!dependencies.empty()) {
    const auto& lineContinue = static_cast<cmGlobalUnixMakefileGenerator3*>(
                                 this->LocalGenerator->GetGlobalGenerator())
                                 ->LineContinueDirective;
    bool supportLongLineDepend = static_cast<cmGlobalUnixMakefileGenerator3*>(
                                   this->LocalGenerator->GetGlobalGenerator())
                                   ->SupportsLongLineDependencies();
    if (supportLongLineDepend) {
      makeDepends << obj_m << ':';
    }
    for (std::string const& dep : dependencies) {
      std::string dependee = this->LocalGenerator->ConvertToMakefilePath(
        this->LocalGenerator->MaybeRelativeToTopBinDir(dep));
      if (supportLongLineDepend) {
        makeDepends << ' ' << lineContinue << ' ' << dependee;
      } else {
        makeDepends << obj_m << ": " << dependee << '\n';
      }
      internalDepends << ' ' << dep << '\n';
    }
    makeDepends << '\n';
  }

  return true;
}